

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O2

bool __thiscall Parse::SMTLIB2::parseAsBuiltinTermSymbol(SMTLIB2 *this,string *id,LExpr *exp)

{
  Stack<Parse::SMTLIB2::ParseResult> *pSVar1;
  ParseResult *pPVar2;
  bool bVar3;
  TermSymbol ts;
  Interpretation IVar4;
  uint uVar5;
  OperatorType *pOVar6;
  Literal *lit;
  TermList TVar7;
  TermList TVar8;
  anon_union_8_2_43a9448f_for_ParseResult_3 aVar9;
  TermList in_R8;
  string *this_00;
  TermList second;
  TermList another;
  TermList args [3];
  allocator<char> local_391;
  TermList theValue;
  TermList first;
  string local_368 [40];
  undefined1 local_340 [16];
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_310;
  undefined1 local_308 [16];
  _Alloc_hider local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_2d8;
  undefined1 local_2d0 [16];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_2a0;
  undefined1 local_298 [16];
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_268;
  undefined1 local_260 [16];
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_230;
  undefined1 local_228 [16];
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_1f8;
  undefined1 local_1f0 [16];
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_1c0;
  undefined1 local_1b8 [16];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_188;
  undefined1 local_180 [16];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_150;
  undefined1 local_148 [16];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_118;
  undefined1 local_110 [16];
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_e0;
  undefined1 local_d8 [16];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_a8;
  undefined1 local_a0 [16];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_70;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_38;
  
  ts = getBuiltInTermSymbol(id);
  bVar3 = false;
  switch(ts) {
  case TS_MULTIPLY:
  case TS_PLUS:
  case TS_MINUS:
  case TS_DIVIDE:
  case TS_DIV:
    first._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&second);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&first);
    std::__cxx11::string::~string((string *)(args + 2));
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
      if (ts != TS_MINUS) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)args,"built-in symbol",(allocator<char> *)&second);
        complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
      }
      IVar4 = getUnaryMinusInterpretation(this,TVar7);
      uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,IVar4);
      local_1f8.frm = (Formula *)Kernel::Term::create1(uVar5,first);
      this_00 = (string *)&local_218;
      local_228[8] = false;
      local_218._M_p = (pointer)&local_208;
      local_210 = 0;
      local_208._M_local_buf[0] = '\0';
      local_228._0_8_ = TVar7;
      Lib::Stack<Parse::SMTLIB2::ParseResult>::push(pSVar1,(ParseResult *)local_228);
    }
    else {
      IVar4 = getTermSymbolInterpretation(this,ts,TVar7);
      uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,IVar4);
      second._content = 2;
      Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
      TVar8 = ParseResult::asTerm((ParseResult *)args,&second);
      std::__cxx11::string::~string((string *)(args + 2));
      if (TVar8._content != TVar7._content) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)args,"built-in symbol",(allocator<char> *)&another);
        complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
      }
      aVar9.frm = (Formula *)Kernel::Term::create2(uVar5,first,second);
      while ((pPVar2 = (this->_results)._cursor, pPVar2 != (this->_results)._stack &&
             (bVar3 = ParseResult::isSeparator(pPVar2 + -1), !bVar3))) {
        another._content = 2;
        Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
        TVar8 = ParseResult::asTerm((ParseResult *)args,&another);
        std::__cxx11::string::~string((string *)(args + 2));
        if (TVar8._content != TVar7._content) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)args,"built-in symbol",(allocator<char> *)&theValue);
          complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
        }
        aVar9.frm = (Formula *)Kernel::Term::create2(uVar5,aVar9.trm,another);
      }
      this_00 = (string *)&local_250;
      local_260[8] = false;
      local_250._M_p = (pointer)&local_240;
      local_248 = 0;
      local_240._M_local_buf[0] = '\0';
      local_260._0_8_ = TVar7;
      local_230 = aVar9;
      Lib::Stack<Parse::SMTLIB2::ParseResult>::push(pSVar1,(ParseResult *)local_260);
    }
    break;
  case TS_ARRAY:
    first._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&second);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    ParseResult::asTerm((ParseResult *)args,&first);
    Kernel::AtomicSort::superSort();
    std::__cxx11::string::~string((string *)(args + 2));
    second._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&another);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    ParseResult::asTerm((ParseResult *)args,&second);
    Kernel::AtomicSort::superSort();
    std::__cxx11::string::~string((string *)(args + 2));
    TVar7 = Kernel::AtomicSort::superSort();
    local_268.trm = Kernel::AtomicSort::arraySort(first,second);
    this_00 = (string *)&local_288;
    local_298[8] = false;
    local_288._M_p = (pointer)&local_278;
    local_280 = 0;
    local_278._M_local_buf[0] = '\0';
    local_298._0_8_ = TVar7;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(pSVar1,(ParseResult *)local_298);
    break;
  case TS_BOOL:
    TVar7 = Kernel::AtomicSort::superSort();
    local_2a0.trm = Kernel::AtomicSort::boolSort();
    this_00 = (string *)&local_2c0;
    local_2d0[8] = false;
    local_2c0._M_p = (pointer)&local_2b0;
    local_2b8 = 0;
    local_2b0._M_local_buf[0] = '\0';
    local_2d0._0_8_ = TVar7;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(&this->_results,(ParseResult *)local_2d0);
    break;
  case TS_INT:
    TVar7 = Kernel::AtomicSort::superSort();
    local_2d8.trm = Kernel::AtomicSort::intSort();
    this_00 = (string *)&local_2f8;
    local_308[8] = false;
    local_2f8._M_p = (pointer)&local_2e8;
    local_2f0 = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_308._0_8_ = TVar7;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(&this->_results,(ParseResult *)local_308);
    break;
  case TS_REAL:
    TVar7 = Kernel::AtomicSort::superSort();
    local_310.trm = Kernel::AtomicSort::realSort();
    this_00 = (string *)&local_330;
    local_340[8] = false;
    local_330._M_p = (pointer)&local_320;
    local_328 = 0;
    local_320._M_local_buf[0] = '\0';
    local_340._0_8_ = TVar7;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(&this->_results,(ParseResult *)local_340);
    break;
  case TS_ABS:
    first._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0bb4:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&second);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,&this->_results);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&first);
    TVar8 = Kernel::AtomicSort::intSort();
    std::__cxx11::string::~string((string *)(args + 2));
    if (TVar7._content != TVar8._content) goto LAB_004e0bb4;
    uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,INT_ABS);
    aVar9.frm = (Formula *)Kernel::Term::create1(uVar5,first);
    local_1b8._0_8_ = Kernel::AtomicSort::intSort();
    this_00 = (string *)&local_1a8;
    local_1b8[8] = false;
    local_1a8._M_p = (pointer)&local_198;
    local_1a0 = 0;
    local_198._M_local_buf[0] = '\0';
    local_188.frm = aVar9.frm;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(&this->_results,(ParseResult *)local_1b8);
    break;
  case TS_ITE:
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0b48:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&second);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    bVar3 = ParseResult::asFormula((ParseResult *)args,(Formula **)&first);
    std::__cxx11::string::~string((string *)(args + 2));
    if (!bVar3) goto LAB_004e0b48;
    second._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&another);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&second);
    std::__cxx11::string::~string((string *)(args + 2));
    another._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0c54:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&theValue);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    TVar8 = ParseResult::asTerm((ParseResult *)args,&another);
    std::__cxx11::string::~string((string *)(args + 2));
    if (TVar8._content != TVar7._content) goto LAB_004e0c54;
    local_38.frm = (Formula *)
                   Kernel::Term::createITE((Formula *)first._content,second,another,TVar7);
    this_00 = (string *)&local_58;
    local_68[8] = false;
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_68._0_8_ = TVar7;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(pSVar1,(ParseResult *)local_68);
    break;
  default:
    goto switchD_004dfda2_caseD_b;
  case TS_MOD:
    second._content = 2;
    another._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0be2:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&first);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&second);
    TVar8 = Kernel::AtomicSort::intSort();
    if ((TVar7._content != TVar8._content) ||
       ((pPVar2 = (this->_results)._cursor, pPVar2 == (this->_results)._stack ||
        (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)))) {
      std::__cxx11::string::~string((string *)(args + 2));
      goto LAB_004e0be2;
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&first,pSVar1);
    TVar7 = ParseResult::asTerm((ParseResult *)&first,&another);
    TVar8 = Kernel::AtomicSort::intSort();
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string((string *)(args + 2));
    if (TVar7._content != TVar8._content) goto LAB_004e0be2;
    uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,INT_REMAINDER_E);
    aVar9.frm = (Formula *)Kernel::Term::create2(uVar5,second,another);
    local_1f0._0_8_ = Kernel::AtomicSort::intSort();
    this_00 = (string *)&local_1e0;
    local_1f0[8] = false;
    local_1e0._M_p = (pointer)&local_1d0;
    local_1d8 = 0;
    local_1d0._M_local_buf[0] = '\0';
    local_1c0.frm = aVar9.frm;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(pSVar1,(ParseResult *)local_1f0);
    break;
  case TS_SELECT:
    first._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&second);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    second = ParseResult::asTerm((ParseResult *)args,&first);
    std::__cxx11::string::~string((string *)(args + 2));
    bVar3 = Kernel::TermList::isArraySort(&second);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&another);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    another._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0c2e:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&theValue);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&another);
    TVar8 = Kernel::SortHelper::getIndexSort(second);
    std::__cxx11::string::~string((string *)(args + 2));
    if (TVar7._content != TVar8._content) goto LAB_004e0c2e;
    TVar7 = Kernel::SortHelper::getInnerSort(second);
    TVar8 = Kernel::AtomicSort::boolSort();
    if (TVar7._content == TVar8._content) {
      pOVar6 = Kernel::Theory::getArrayOperatorType(second,ARRAY_BOOL_SELECT);
      uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,ARRAY_BOOL_SELECT,pOVar6);
      aVar9.frm = (Formula *)Kernel::AtomicFormula::operator_new(0x30);
      lit = Kernel::Literal::create2
                      ((Literal *)(ulong)uVar5,1,SUB81(first._content,0),another,in_R8);
      Kernel::AtomicFormula::AtomicFormula((AtomicFormula *)aVar9.frm,lit);
      local_110._0_8_ = Kernel::AtomicSort::boolSort();
      this_00 = (string *)&local_100;
      local_110[8] = true;
      local_100._M_p = (pointer)&local_f0;
      local_f8 = 0;
      local_f0._M_local_buf[0] = '\0';
      local_e0.frm = aVar9.frm;
      Lib::Stack<Parse::SMTLIB2::ParseResult>::push(pSVar1,(ParseResult *)local_110);
    }
    else {
      pOVar6 = Kernel::Theory::getArrayOperatorType(second,ARRAY_SELECT);
      uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,ARRAY_SELECT,pOVar6);
      aVar9.frm = (Formula *)Kernel::Term::create2(uVar5,first,another);
      local_148._0_8_ = Kernel::SortHelper::getInnerSort(second);
      this_00 = (string *)&local_138;
      local_148[8] = false;
      local_138._M_p = (pointer)&local_128;
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      local_118.frm = aVar9.frm;
      Lib::Stack<Parse::SMTLIB2::ParseResult>::push(pSVar1,(ParseResult *)local_148);
    }
    break;
  case TS_STORE:
    first._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&second);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    second = ParseResult::asTerm((ParseResult *)args,&first);
    std::__cxx11::string::~string((string *)(args + 2));
    bVar3 = Kernel::TermList::isArraySort(&second);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&another);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    another._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0c08:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&theValue);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&another);
    TVar8 = Kernel::SortHelper::getIndexSort(second);
    std::__cxx11::string::~string((string *)(args + 2));
    if (TVar7._content != TVar8._content) goto LAB_004e0c08;
    theValue._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0c7a:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",&local_391);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,pSVar1);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&theValue);
    TVar8 = Kernel::SortHelper::getInnerSort(second);
    std::__cxx11::string::~string((string *)(args + 2));
    if (TVar7._content != TVar8._content) goto LAB_004e0c7a;
    pOVar6 = Kernel::Theory::getArrayOperatorType(second,ARRAY_STORE);
    uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,ARRAY_STORE,pOVar6);
    args[0] = first;
    args[1] = another;
    args[2] = theValue;
    local_150.frm = (Formula *)Kernel::Term::create(uVar5,3,args);
    this_00 = (string *)&local_170;
    local_180._0_8_ = second._content;
    local_180[8] = false;
    local_170._M_p = (pointer)&local_160;
    local_168 = 0;
    local_160._M_local_buf[0] = '\0';
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(pSVar1,(ParseResult *)local_180);
    break;
  case TS_TO_INT:
    first._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0b6c:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&second);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,&this->_results);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&first);
    TVar8 = Kernel::AtomicSort::realSort();
    std::__cxx11::string::~string((string *)(args + 2));
    if (TVar7._content != TVar8._content) goto LAB_004e0b6c;
    uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,REAL_TO_INT);
    aVar9.frm = (Formula *)Kernel::Term::create1(uVar5,first);
    local_d8._0_8_ = Kernel::AtomicSort::intSort();
    this_00 = (string *)&local_c8;
    local_d8[8] = false;
    local_c8._M_p = (pointer)&local_b8;
    local_c0 = 0;
    local_b8._M_local_buf[0] = '\0';
    local_a8.frm = aVar9.frm;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(&this->_results,(ParseResult *)local_d8);
    break;
  case TS_TO_REAL:
    first._content = 2;
    pPVar2 = (this->_results)._cursor;
    if ((pPVar2 == (this->_results)._stack) ||
       (bVar3 = ParseResult::isSeparator(pPVar2 + -1), bVar3)) {
LAB_004e0b90:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)args,"built-in symbol",(allocator<char> *)&second);
      complainAboutArgShortageOrWrongSorts(this,(string *)args,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)args,&this->_results);
    TVar7 = ParseResult::asTerm((ParseResult *)args,&first);
    TVar8 = Kernel::AtomicSort::intSort();
    std::__cxx11::string::~string((string *)(args + 2));
    if (TVar7._content != TVar8._content) goto LAB_004e0b90;
    uVar5 = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,INT_TO_REAL);
    aVar9.frm = (Formula *)Kernel::Term::create1(uVar5,first);
    local_a0._0_8_ = Kernel::AtomicSort::realSort();
    this_00 = (string *)&local_90;
    local_a0[8] = false;
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70.frm = aVar9.frm;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::push(&this->_results,(ParseResult *)local_a0);
  }
  std::__cxx11::string::~string(this_00);
  bVar3 = true;
switchD_004dfda2_caseD_b:
  return bVar3;
}

Assistant:

bool SMTLIB2::parseAsBuiltinTermSymbol(const std::string& id, LExpr* exp)
{
  // try built-in term symbols
  TermSymbol ts = getBuiltInTermSymbol(id);
  switch(ts) {
    case TS_ITE:
    {
      Formula* cond;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          !(_results.pop().asFormula(cond))) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList thenBranch;
      if (_results.isEmpty() || _results.top().isSeparator()){
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList sort = _results.pop().asTerm(thenBranch);
      TermList elseBranch;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(elseBranch) != sort){
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList res = TermList(Term::createITE(cond, thenBranch, elseBranch, sort));

      _results.push(ParseResult(sort,res));
      return true;
    }
    case TS_TO_REAL:
    {
      TermList theInt;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theInt) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_TO_REAL);
      TermList res = TermList(Term::create1(fun,theInt));

      _results.push(ParseResult(AtomicSort::realSort(),res));
      return true;
    }
    case TS_TO_INT:
    {
      TermList theReal;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theReal) != AtomicSort::realSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::REAL_TO_INT);
      TermList res = TermList(Term::create1(fun,theReal));

      _results.push(ParseResult(AtomicSort::intSort(),res));
      return true;
    }
    case TS_SELECT:
    {
      TermList theArray;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList arraySortIdx = _results.pop().asTerm(theArray);
      if (!arraySortIdx.isArraySort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theIndex;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theIndex) != SortHelper::getIndexSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      if (SortHelper::getInnerSort(arraySortIdx)== AtomicSort::boolSort()) {
        OperatorType* predType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_BOOL_SELECT);
        unsigned pred = env.signature->getInterpretingSymbol(Theory::ARRAY_BOOL_SELECT,predType);

        Formula* res = new AtomicFormula(Literal::create2(pred,true,theArray,theIndex));

        _results.push(ParseResult(res));
      } else {
        OperatorType* funType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_SELECT);
        unsigned fun = env.signature->getInterpretingSymbol(Theory::ARRAY_SELECT,funType);

        TermList res = TermList(Term::create2(fun,theArray,theIndex));

        _results.push(ParseResult(SortHelper::getInnerSort(arraySortIdx),res));
      }

      return true;
    }
    case TS_STORE:
    {
      TermList theArray;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList arraySortIdx = _results.pop().asTerm(theArray);
      if (!arraySortIdx.isArraySort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theIndex;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theIndex) != SortHelper::getIndexSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theValue;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theValue) != SortHelper::getInnerSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      OperatorType* funType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_STORE);
      unsigned fun = env.signature->getInterpretingSymbol(Theory::ARRAY_STORE,funType);

      TermList args[] = {theArray, theIndex, theValue};
      TermList res = TermList(Term::create(fun, 3, args));

      _results.push(ParseResult(arraySortIdx,res));

      return true;
    }
    case TS_ABS:
    {
      TermList theInt;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theInt) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_ABS);
      TermList res = TermList(Term::create1(fun,theInt));

      _results.push(ParseResult(AtomicSort::intSort(),res));

      return true;
    }
    case TS_MOD:
    {
      TermList int1, int2;
      if (_results.isEmpty() || _results.top().isSeparator() || _results.pop().asTerm(int1) != AtomicSort::intSort() ||
          _results.isEmpty() || _results.top().isSeparator() || _results.pop().asTerm(int2) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_REMAINDER_E); // TS_MOD is the always positive remainder, therefore INT_REMAINDER_E
      TermList res = TermList(Term::create2(fun,int1,int2));

      _results.push(ParseResult(AtomicSort::intSort(),res));

      return true;
    }
    case TS_MULTIPLY:
    case TS_PLUS:
    case TS_MINUS:
    case TS_DIVIDE:
    case TS_DIV:
    {
      // read the first argument
      TermList first;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList sort = _results.pop().asTerm(first);

      if (_results.isEmpty() || _results.top().isSeparator()) {
        if (ts == TS_MINUS) { // unary minus
          Interpretation intp = getUnaryMinusInterpretation(sort);
          unsigned fun = env.signature->getInterpretingSymbol(intp);

          TermList res = TermList(Term::create1(fun,first));

          _results.push(ParseResult(sort,res));

          return true;
        } else {
          complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp); // we need at least two arguments otherwise
        }
      }

      Interpretation intp = getTermSymbolInterpretation(ts,sort);
      unsigned fun = env.signature->getInterpretingSymbol(intp);

      TermList second;
      if (_results.pop().asTerm(second) != sort) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList res = TermList(Term::create2(fun,first,second));
      while (_results.isNonEmpty() && !_results.top().isSeparator()) {
        TermList another;
        if (_results.pop().asTerm(another) != sort) {
          complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
        }

        res = TermList(Term::create2(fun,res,another));
      }
      _results.push(ParseResult(sort,res));

      return true;
    }
    case TS_ARRAY:
    {
      TermList indexSort;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      ALWAYS(_results.pop().asTerm(indexSort) == AtomicSort::superSort());
      TermList innerSort;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      ALWAYS(_results.pop().asTerm(innerSort) == AtomicSort::superSort());
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::arraySort(indexSort, innerSort)));
      return true;
    }
    case TS_BOOL:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::boolSort()));
      return true;
    }
    case TS_INT:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::intSort()));
      return true;
    }
    case TS_REAL:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::realSort()));
      return true;
    }
    default:
      ASS_EQ(ts,TS_USER_FUNCTION);
      return false;
  }
}